

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  String *pSVar1;
  bool bVar2;
  ValueType VVar3;
  ArrayIndex AVar4;
  Json *pJVar5;
  Value *pVVar6;
  PrecisionType precisionType;
  bool value_00;
  LargestUInt value_01;
  LargestInt value_02;
  char cVar7;
  undefined1 in_R8B;
  ArrayIndex index;
  ArrayIndex index_00;
  String *key;
  double value_03;
  String local_70;
  char *str;
  String *local_48;
  char *end;
  
  VVar3 = Value::type(value);
  precisionType = 0x1333d4;
  switch(VVar3) {
  case nullValue:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_02);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_01);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case realValue:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_70,(Json *)0x11,value_03,0,precisionType);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case stringValue:
    bVar2 = Value::getString(value,&str,&end);
    if (!bVar2) {
      return;
    }
    valueToQuotedStringN_abi_cxx11_(&local_70,(Json *)str,end + -(long)str,0,(bool)in_R8B);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    valueToString_abi_cxx11_(&local_70,(Json *)(ulong)bVar2,value_00);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case arrayValue:
    cVar7 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar7);
    AVar4 = Value::size(value);
    for (index_00 = 0; AVar4 != index_00; index_00 = index_00 + 1) {
      if (index_00 != 0) {
        std::__cxx11::string::push_back(cVar7);
      }
      pVVar6 = Value::operator[](value,index_00);
      writeValue(this,pVVar6);
    }
    std::__cxx11::string::push_back(cVar7);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)&str,value);
    pSVar1 = &this->document_;
    cVar7 = (char)pSVar1;
    std::__cxx11::string::push_back(cVar7);
    for (key = (String *)str; key != local_48; key = key + 1) {
      if (key != (String *)str) {
        std::__cxx11::string::push_back(cVar7);
      }
      valueToQuotedStringN_abi_cxx11_
                (&local_70,(Json *)(key->_M_dataplus)._M_p,(char *)key->_M_string_length,0,
                 (bool)in_R8B);
      std::__cxx11::string::append((string *)pSVar1);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)pSVar1);
      pVVar6 = Value::operator[](value,key);
      writeValue(this,pVVar6);
    }
    std::__cxx11::string::push_back(cVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
  default:
    goto switchD_0012cc27_default;
  }
  std::__cxx11::string::~string((string *)&local_70);
switchD_0012cc27_default:
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      document_ += valueToQuotedStringN(str, static_cast<size_t>(end - str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (auto it = members.begin(); it != members.end(); ++it) {
      const String& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), name.length());
      document_ += yamlCompatibilityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}